

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_label_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gnode_t *pgVar1;
  gnode_t *local_70;
  gnode_t *stmt;
  gnode_t *expr;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&expr,lexer_00);
  if ((token.value._4_4_ != TOK_KEY_CASE) && (token.value._4_4_ != TOK_KEY_DEFAULT)) {
    __assert_fail("(type == TOK_KEY_CASE) || (type == TOK_KEY_DEFAULT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x862,"gnode_t *parse_label_statement(gravity_parser_t *)");
  }
  stmt = (gnode_t *)0x0;
  if (token.value._4_4_ == TOK_KEY_CASE) {
    stmt = parse_expression(parser);
  }
  parse_required(parser,TOK_OP_COLON);
  pgVar1 = parse_statement(parser);
  if (parser->declarations->n == 0) {
    local_70 = (gnode_t *)0x0;
  }
  else {
    local_70 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.colno = token.type;
  token_00.position = token.lineno;
  token_00._0_8_ = expr;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgVar1 = gnode_label_stat_create(token_00,stmt,pgVar1,local_70);
  return pgVar1;
}

Assistant:

static gnode_t *parse_label_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_label_statement");

    // 'case' expression ':' statement
    // 'default' ':' statement

    DECLARE_LEXER;
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert((type == TOK_KEY_CASE) || (type == TOK_KEY_DEFAULT));

    // case specific expression
    gnode_t *expr = NULL;
    if (type == TOK_KEY_CASE) {
        expr = parse_expression(parser);
    }

    // common part
    parse_required(parser, TOK_OP_COLON);
    gnode_t *stmt = parse_statement(parser);

    return gnode_label_stat_create(token, expr, stmt, LAST_DECLARATION());
}